

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

TPZCompElSide __thiscall TPZCheckMesh::FindElement(TPZCheckMesh *this,int connect)

{
  TPZCompEl *cel_00;
  int iVar1;
  int iVar2;
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  int64_t iVar3;
  TPZCompEl **ppTVar4;
  long *plVar5;
  TPZGeoEl *pTVar6;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  undefined8 *in_RSI;
  TPZCompEl *in_RDI;
  TPZCompElSide TVar8;
  int64_t index;
  int ic;
  int nsc;
  int side;
  int ns;
  TPZGeoEl *gel;
  TPZInterpolatedElement *intel;
  TPZCompEl *cel;
  int el;
  int nelem;
  TPZCompElSide *nullside;
  long *plVar9;
  TPZCompEl *pTVar10;
  TPZCompEl *this_01;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_ffffffffffffffb0;
  int local_48;
  int local_40;
  int local_1c;
  
  this_01 = in_RDI;
  this_00 = TPZCompMesh::ElementVec((TPZCompMesh *)*in_RSI);
  iVar3 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>);
  local_1c = 0;
  do {
    if ((int)iVar3 <= local_1c) {
      TPZCompElSide::TPZCompElSide((TPZCompElSide *)this_01);
      uVar7 = extraout_RDX_00;
LAB_019efa3c:
      TVar8._8_8_ = uVar7;
      TVar8.fEl = in_RDI;
      return TVar8;
    }
    TPZCompMesh::ElementVec((TPZCompMesh *)*in_RSI);
    ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[](in_stack_ffffffffffffffb0,(int64_t)in_RSI)
    ;
    cel_00 = *ppTVar4;
    if (cel_00 != (TPZCompEl *)0x0) {
      pTVar10 = cel_00;
      if (cel_00 == (TPZCompEl *)0x0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(cel_00,&TPZCompEl::typeinfo,
                                        &TPZInterpolatedElement::typeinfo,0);
      }
      plVar9 = plVar5;
      pTVar6 = TPZCompEl::Reference(this_01);
      iVar1 = (**(code **)(*(long *)pTVar6 + 0xf0))();
      for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
        iVar2 = (**(code **)(*plVar5 + 0x248))(plVar5,local_40);
        for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
          in_stack_ffffffffffffffb0 =
               (TPZChunkVector<TPZCompEl_*,_10> *)
               TPZInterpolatedElement::SideConnectIndex
                         ((TPZInterpolatedElement *)pTVar10,(int)((ulong)plVar9 >> 0x20),(int)plVar9
                         );
          if (in_stack_ffffffffffffffb0 == (TPZChunkVector<TPZCompEl_*,_10> *)(long)in_EDX) {
            TPZCompElSide::TPZCompElSide((TPZCompElSide *)this_01,cel_00,local_40);
            uVar7 = extraout_RDX;
            goto LAB_019efa3c;
          }
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

TPZCompElSide TPZCheckMesh::FindElement(int connect) {
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        TPZGeoEl *gel = cel->Reference();
        int ns = gel->NSides();
		
		for(int side=0; side<ns; side++) {
            int nsc = intel->NSideConnects(side);
            for (int ic=0; ic<nsc; ic++)
            {
                int64_t index = intel->SideConnectIndex(ic, side);
                if(index == connect) {
                    return TPZCompElSide(cel,side);
                }
			}
		}
	}
	TPZCompElSide nullside;
	return nullside;
}